

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O3

double get_value(shared_ptr<SchemeObject> *p,string *error_msg)

{
  element_type *peVar1;
  long lVar2;
  runtime_error *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar3;
  
  peVar1 = (p->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    lVar2 = __dynamic_cast(peVar1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
    if (lVar2 == 0) {
      lVar2 = __dynamic_cast(peVar1,&SchemeObject::typeinfo,&SchemeFloat::typeinfo,0);
      if (lVar2 == 0) goto LAB_00138790;
      this_00 = (p->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return *(double *)(lVar2 + 8);
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      dVar3 = *(double *)(lVar2 + 8);
    }
    else {
      this_00 = (p->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return (double)*(long *)(lVar2 + 8);
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      dVar3 = (double)*(long *)(lVar2 + 8);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return dVar3;
  }
LAB_00138790:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)error_msg);
  *(undefined ***)this = &PTR__runtime_error_0017a350;
  __cxa_throw(this,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static double get_value(std::shared_ptr<SchemeObject> p, const std::string &error_msg)
{
    auto pi = std::dynamic_pointer_cast<SchemeInt>(p);
    if(pi)
        return pi->value;
    auto pf = std::dynamic_pointer_cast<SchemeFloat>(p);
    if(pf)
        return pf->value;
    throw eval_error(error_msg);
}